

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O3

void __thiscall PluginFverb::PluginFverb(PluginFverb *this)

{
  float fVar1;
  double dVar2;
  Fverb *this_00;
  uint uVar3;
  undefined4 local_e0 [2];
  String local_d8;
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  undefined8 local_60;
  undefined4 local_58;
  ParameterEnumerationValues local_50;
  undefined4 local_40;
  undefined1 local_3c;
  undefined4 local_38;
  
  DISTRHO::Plugin::Plugin(&this->super_Plugin,0xf,0,0);
  (this->super_Plugin)._vptr_Plugin = (_func_int **)&PTR__PluginFverb_00114cd0;
  this_00 = (Fverb *)operator_new(8);
  Fverb::Fverb(this_00);
  (this->fDsp)._M_t.super___uniq_ptr_impl<Fverb,_std::default_delete<Fverb>_>._M_t.
  super__Tuple_impl<0UL,_Fverb_*,_std::default_delete<Fverb>_>.super__Head_base<0UL,_Fverb_*,_false>
  ._M_head_impl = this_00;
  this->fBypass = 0.0;
  *(undefined4 *)((long)&this->fBypass + 3) = 0;
  (this->fDry).step = 0.0;
  (this->fDry).target = 0.0;
  (this->fDry).mem = 0.0;
  (this->fDry).tau = 0.0;
  *(undefined8 *)&(this->fDry).sampleRate = 0;
  (this->fWet).target = 0.0;
  (this->fWet).mem = 0.0;
  (this->fWet).tau = 0.0;
  (this->fWet).sampleRate = 0.0;
  WDL_Resampler::WDL_Resampler(&this->fDownsampler);
  WDL_Resampler::WDL_Resampler(&this->fUpsampler);
  memset(&this->fLastDspOutputs,0,200);
  uVar3 = 0;
  do {
    local_e0[0] = 0;
    local_d8.fBuffer = &DISTRHO::String::_null()::sNull;
    local_d8.fBufferLen = 0;
    local_d8.fBufferAlloc = false;
    local_c0.fBuffer = &DISTRHO::String::_null()::sNull;
    local_c0.fBufferLen = 0;
    local_c0.fBufferAlloc = false;
    local_a8.fBuffer = &DISTRHO::String::_null()::sNull;
    local_a8.fBufferLen = 0;
    local_a8.fBufferAlloc = false;
    local_90.fBuffer = &DISTRHO::String::_null()::sNull;
    local_90.fBufferLen = 0;
    local_90.fBufferAlloc = false;
    local_78.fBuffer = &DISTRHO::String::_null()::sNull;
    local_78.fBufferLen = 0;
    local_78.fBufferAlloc = false;
    local_60 = 0;
    local_58 = 0x3f800000;
    local_50.count = '\0';
    local_50.restrictedMode = false;
    local_50.values = (ParameterEnumerationValue *)0x0;
    local_40 = 0;
    local_3c = 0;
    local_38 = 0xffffffff;
    (*(this->super_Plugin)._vptr_Plugin[0xb])(this,(ulong)uVar3,local_e0);
    (*(this->super_Plugin)._vptr_Plugin[0xe])((undefined4)local_60,this,(ulong)uVar3);
    DISTRHO::ParameterEnumerationValues::~ParameterEnumerationValues(&local_50);
    DISTRHO::String::~String(&local_78);
    DISTRHO::String::~String(&local_90);
    DISTRHO::String::~String(&local_a8);
    DISTRHO::String::~String(&local_c0);
    DISTRHO::String::~String(&local_d8);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0xf);
  fVar1 = (this->fDry).tau;
  if ((fVar1 != 0.005) || (NAN(fVar1))) {
    (this->fDry).tau = 0.005;
    (this->fDry).step = ((this->fDry).target - (this->fDry).mem) / ((this->fDry).sampleRate * 0.005)
    ;
  }
  fVar1 = (this->fWet).tau;
  if ((fVar1 != 0.005) || (NAN(fVar1))) {
    (this->fWet).tau = 0.005;
    (this->fWet).step = ((this->fWet).target - (this->fWet).mem) / ((this->fWet).sampleRate * 0.005)
    ;
  }
  dVar2 = DISTRHO::Plugin::getSampleRate(&this->super_Plugin);
  (*(this->super_Plugin)._vptr_Plugin[0x13])(SUB84(dVar2,0),this);
  return;
}

Assistant:

PluginFverb::PluginFverb()
    : Plugin(kNumParameters, 0, 0),
      fDsp(new Fverb)
{
    for (unsigned p = 0; p < kNumParameters; ++p) {
        Parameter param;
        initParameter(p, param);
        setParameterValue(p, param.ranges.def);
    }

    float tau = 5e-3;
    fDry.setTimeConstant(tau);
    fWet.setTimeConstant(tau);

    sampleRateChanged(getSampleRate());
}